

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator.hpp
# Opt level: O3

walk_result __thiscall
jsoncons::jsonschema::
min_contains_keyword<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::validate(min_contains_keyword<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *this,eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                 *context,json_pointer *instance_location,size_t count,error_reporter *reporter)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  long *plVar4;
  undefined1 *puVar5;
  long *plVar6;
  undefined1 *puVar7;
  walk_result wVar8;
  char cVar9;
  string __str;
  string message;
  string __str_1;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  this_context;
  long *local_1e0;
  long local_1d8;
  long local_1d0;
  long lStack_1c8;
  long *local_1c0;
  long local_1b8;
  long local_1b0;
  long lStack_1a8;
  long *local_1a0;
  uint local_198;
  long local_190 [2];
  long *local_180;
  long local_178;
  long local_170;
  long lStack_168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_160;
  long *local_148;
  long local_138 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  long *local_a0;
  long local_90 [2];
  vector<jsoncons::jsonschema::validation_message,_std::allocator<jsoncons::jsonschema::validation_message>_>
  local_80;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  local_68;
  
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::eval_context(&local_68,context,
                 &(this->
                  super_keyword_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  ).keyword_name_);
  puVar7 = (undefined1 *)this->min_value_;
  if (count < puVar7) {
    cVar9 = '\x01';
    if ((undefined1 *)0x9 < puVar7) {
      puVar5 = puVar7;
      cVar2 = '\x04';
      do {
        cVar9 = cVar2;
        if (puVar5 < (undefined1 *)0x64) {
          cVar9 = cVar9 + -2;
          goto LAB_0045c774;
        }
        if (puVar5 < (undefined1 *)0x3e8) {
          cVar9 = cVar9 + -1;
          goto LAB_0045c774;
        }
        if (puVar5 < &DAT_00002710) goto LAB_0045c774;
        bVar1 = (undefined1 *)0x1869f < puVar5;
        puVar5 = (undefined1 *)((ulong)puVar5 / 10000);
        cVar2 = cVar9 + '\x04';
      } while (bVar1);
      cVar9 = cVar9 + '\x01';
    }
LAB_0045c774:
    local_1e0 = &local_1d0;
    std::__cxx11::string::_M_construct((ulong)&local_1e0,cVar9);
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)local_1e0,(uint)local_1d8,(unsigned_long)puVar7);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_1e0,0,(char *)0x0,0x87c7cb);
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_170 = *plVar6;
      lStack_168 = plVar4[3];
      local_180 = &local_170;
    }
    else {
      local_170 = *plVar6;
      local_180 = (long *)*plVar4;
    }
    local_178 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_180);
    local_1c0 = &local_1b0;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_1b0 = *plVar6;
      lStack_1a8 = plVar4[3];
    }
    else {
      local_1b0 = *plVar6;
      local_1c0 = (long *)*plVar4;
    }
    local_1b8 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if (local_180 != &local_170) {
      operator_delete(local_180,local_170 + 1);
    }
    if (local_1e0 != &local_1d0) {
      operator_delete(local_1e0,local_1d0 + 1);
    }
    cVar9 = '\x01';
    if (9 < count) {
      puVar7 = (undefined1 *)count;
      cVar2 = '\x04';
      do {
        cVar9 = cVar2;
        if (puVar7 < (undefined1 *)0x64) {
          cVar9 = cVar9 + -2;
          goto LAB_0045c8e0;
        }
        if (puVar7 < (undefined1 *)0x3e8) {
          cVar9 = cVar9 + -1;
          goto LAB_0045c8e0;
        }
        if (puVar7 < &DAT_00002710) goto LAB_0045c8e0;
        bVar1 = (undefined1 *)0x1869f < puVar7;
        puVar7 = (undefined1 *)((ulong)puVar7 / 10000);
        cVar2 = cVar9 + '\x04';
      } while (bVar1);
      cVar9 = cVar9 + '\x01';
    }
LAB_0045c8e0:
    local_1a0 = local_190;
    std::__cxx11::string::_M_construct((ulong)&local_1a0,cVar9);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_1a0,local_198,count);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_1a0,0,(char *)0x0,0x87c7b2);
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_1d0 = *plVar6;
      lStack_1c8 = plVar4[3];
      local_1e0 = &local_1d0;
    }
    else {
      local_1d0 = *plVar6;
      local_1e0 = (long *)*plVar4;
    }
    local_1d8 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_1e0);
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_170 = *plVar6;
      lStack_168 = plVar4[3];
      local_180 = &local_170;
    }
    else {
      local_170 = *plVar6;
      local_180 = (long *)*plVar4;
    }
    local_178 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_1c0,(ulong)local_180);
    if (local_180 != &local_170) {
      operator_delete(local_180,local_170 + 1);
    }
    if (local_1e0 != &local_1d0) {
      operator_delete(local_1e0,local_1d0 + 1);
    }
    if (local_1a0 != local_190) {
      operator_delete(local_1a0,local_190[0] + 1);
    }
    (*(this->
      super_keyword_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
      ).super_validation_message_factory._vptr_validation_message_factory[2])
              (&local_180,this,&local_68.eval_path_,instance_location,&local_1c0);
    reporter->error_count_ = reporter->error_count_ + 1;
    iVar3 = (*reporter->_vptr_error_reporter[2])(reporter,&local_180);
    std::
    vector<jsoncons::jsonschema::validation_message,_std::allocator<jsoncons::jsonschema::validation_message>_>
    ::~vector(&local_80);
    if (local_a0 != local_90) {
      operator_delete(local_a0,local_90[0] + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_b8);
    if (local_148 != local_138) {
      operator_delete(local_148,local_138[0] + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_160);
    if (local_180 != &local_170) {
      operator_delete(local_180,local_170 + 1);
    }
    if (local_1c0 != &local_1b0) {
      operator_delete(local_1c0,local_1b0 + 1);
    }
    wVar8 = abort;
    if (iVar3 == 1) goto LAB_0045cb02;
  }
  wVar8 = advance;
LAB_0045cb02:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68.eval_path_.tokens_);
  if (local_68.dynamic_scope_.
      super__Vector_base<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::allocator<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.dynamic_scope_.
                    super__Vector_base<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::allocator<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.dynamic_scope_.
                          super__Vector_base<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::allocator<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.dynamic_scope_.
                          super__Vector_base<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::allocator<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return wVar8;
}

Assistant:

walk_result validate(const eval_context<Json>& context, 
            const jsonpointer::json_pointer& instance_location,
            std::size_t count, 
            error_reporter& reporter) const 
        {
            eval_context<Json> this_context(context, this->keyword_name());

            if (count < min_value_)
            {
                std::string message("A schema must match a contains constraint at least " + std::to_string(min_value_) + " times");
                message.append(" but it matched " + std::to_string(count) + " times.");
                walk_result result = reporter.error(this->make_validation_message(
                    this_context.eval_path(),
                    instance_location, 
                    std::move(message)));
                if (result == walk_result::abort)
                {
                    return result;
                }
            }
            return walk_result::advance;
        }